

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddReorder.c
# Opt level: O3

int cuddSwapInPlace(DdManager *table,int x,int y)

{
  DdHalfWord *pDVar1;
  DdHalfWord x_00;
  DdHalfWord y_00;
  uint uVar2;
  uint uVar3;
  int iVar4;
  DdHalfWord DVar5;
  DdHalfWord DVar6;
  Cudd_LazyGroupType CVar7;
  DdSubtable *pDVar8;
  DdNode **ppDVar9;
  DdManager *pDVar10;
  int *piVar11;
  uint uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  DdNode *pDVar15;
  DdManager *pDVar16;
  DdSubtable *pDVar17;
  DdSubtable *pDVar18;
  Cudd_VariableType CVar19;
  Cudd_VariableType CVar20;
  undefined1 auVar21 [16];
  _func_void_long *p_Var22;
  int iVar23;
  uint uVar24;
  int iVar25;
  uint uVar26;
  ulong uVar27;
  DdNode **ppDVar28;
  DdNode *pDVar29;
  DdNode *pDVar30;
  DdNode **ppDVar31;
  ulong uVar32;
  long lVar33;
  DdNode *pDVar34;
  DdNode *pDVar35;
  uint uVar36;
  DdNode *pDVar37;
  DdNode *pDVar38;
  DdNode *pDVar39;
  uint uVar40;
  DdNode **ppDVar41;
  DdManager *pDVar42;
  DdManager *pDVar43;
  DdNode *pDVar44;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar48 [16];
  int local_dc;
  uint local_c8;
  uint local_b0;
  long lVar47;
  
  ddTotalNumberSwapping = ddTotalNumberSwapping + 1;
  pDVar8 = table->subtables;
  x_00 = table->invperm[x];
  ppDVar41 = pDVar8[x].nodelist;
  uVar40 = pDVar8[x].keys;
  local_b0 = pDVar8[x].slots;
  uVar32 = (ulong)local_b0;
  local_dc = pDVar8[x].shift;
  y_00 = table->invperm[y];
  ppDVar9 = pDVar8[y].nodelist;
  uVar2 = pDVar8[y].keys;
  uVar3 = pDVar8[y].slots;
  iVar4 = pDVar8[y].shift;
  iVar23 = cuddTestInteract(table,x_00,y_00);
  local_c8 = uVar2;
  uVar26 = uVar40;
  if (iVar23 == 0) goto LAB_0080d18f;
  DVar5 = table->vars[(int)x_00]->ref;
  DVar6 = table->vars[(int)y_00]->ref;
  if ((int)uVar40 < (int)local_b0) {
    if ((int)(local_b0 * 4) < (int)uVar40 || local_b0 != table->initSlots) goto LAB_0080ca64;
LAB_0080c9b3:
    if (0 < (int)local_b0) {
      uVar27 = 0;
      pDVar42 = (DdManager *)0x0;
      uVar26 = 0;
      do {
        ppDVar28 = ppDVar41 + uVar27;
        pDVar43 = (DdManager *)*ppDVar28;
        while (pDVar10 = pDVar43, pDVar10 != table) {
          pDVar43 = (DdManager *)(pDVar10->sentinel).next;
          if ((((pDVar10->sentinel).type.kids.T)->index == y_00) ||
             (*(DdHalfWord *)((ulong)(pDVar10->sentinel).type.kids.E & 0xfffffffffffffffe) == y_00))
          {
            (pDVar10->sentinel).index = y_00;
            (pDVar10->sentinel).next = &pDVar42->sentinel;
            pDVar42 = pDVar10;
          }
          else {
            uVar26 = uVar26 + 1;
            *ppDVar28 = &pDVar10->sentinel;
            ppDVar28 = &(pDVar10->sentinel).next;
          }
        }
        *ppDVar28 = &table->sentinel;
        uVar27 = uVar27 + 1;
      } while (uVar27 != uVar32);
      goto joined_r0x0080cd4e;
    }
    uVar26 = 0;
  }
  else {
    if (uVar40 == local_b0 * 4 || SBORROW4(uVar40,local_b0 * 4) != (int)(uVar40 + local_b0 * -4) < 0
       ) goto LAB_0080c9b3;
LAB_0080ca64:
    if ((int)local_b0 < 1) {
      uVar26 = 0;
      pDVar42 = (DdManager *)0x0;
      pDVar43 = (DdManager *)0x0;
      uVar36 = 0;
    }
    else {
      uVar27 = 0;
      pDVar43 = (DdManager *)0x0;
      pDVar42 = (DdManager *)0x0;
      uVar26 = 0;
      do {
        pDVar10 = (DdManager *)ppDVar41[uVar27];
        while (pDVar16 = pDVar10, pDVar16 != table) {
          pDVar10 = (DdManager *)(pDVar16->sentinel).next;
          if ((((pDVar16->sentinel).type.kids.T)->index == y_00) ||
             (*(DdHalfWord *)((ulong)(pDVar16->sentinel).type.kids.E & 0xfffffffffffffffe) == y_00))
          {
            (pDVar16->sentinel).index = y_00;
            (pDVar16->sentinel).next = &pDVar42->sentinel;
            pDVar42 = pDVar16;
          }
          else {
            (pDVar16->sentinel).next = &pDVar43->sentinel;
            uVar26 = uVar26 + 1;
            pDVar43 = pDVar16;
          }
        }
        uVar27 = uVar27 + 1;
        uVar36 = local_b0;
      } while (uVar27 != uVar32);
    }
    p_Var22 = Extra_UtilMMoutOfMemory;
    uVar24 = local_b0 * 4;
    iVar23 = local_dc;
    uVar27 = uVar32;
    while (uVar12 = (uint)uVar27, uVar24 < uVar40) {
      iVar23 = iVar23 + -1;
      uVar27 = (ulong)(uVar12 * 2);
      uVar24 = uVar12 * 8;
    }
    if (uVar40 < uVar12) {
      do {
        if ((uint)uVar27 <= table->initSlots) break;
        iVar23 = iVar23 + 1;
        uVar24 = (uint)uVar27 >> 1;
        uVar27 = (ulong)uVar24;
      } while (uVar40 < uVar24);
    }
    ppDVar28 = (DdNode **)malloc(uVar27 << 3);
    Extra_UtilMMoutOfMemory = p_Var22;
    if (ppDVar28 == (DdNode **)0x0) {
      fprintf((FILE *)table->err,"Unable to resize subtable %d for lack of memory\n",uVar36);
      ppDVar28 = ppDVar41;
      uVar27 = uVar32;
      iVar23 = local_dc;
    }
    else {
      iVar25 = (int)uVar27 - local_b0;
      uVar24 = table->slots + iVar25;
      table->slots = uVar24;
      table->minDead = (uint)(long)((double)uVar24 * table->gcFrac);
      uVar36 = uVar24 * 4;
      if (table->maxCacheHard <= uVar24 * 4) {
        uVar36 = table->maxCacheHard;
      }
      table->cacheSlack = uVar36 + table->cacheSlots * -2;
      table->memused = table->memused + (long)iVar25 * 8;
      if (ppDVar41 != (DdNode **)0x0) {
        free(ppDVar41);
      }
    }
    auVar21 = _DAT_0094e250;
    local_b0 = (uint)uVar27;
    if (0 < (int)local_b0) {
      lVar33 = uVar27 - 1;
      auVar45._8_4_ = (int)lVar33;
      auVar45._0_8_ = lVar33;
      auVar45._12_4_ = (int)((ulong)lVar33 >> 0x20);
      lVar33 = 0;
      auVar45 = auVar45 ^ _DAT_0094e250;
      auVar46 = _DAT_0094e240;
      do {
        auVar48 = auVar46 ^ auVar21;
        if ((bool)(~(auVar48._4_4_ == auVar45._4_4_ && auVar45._0_4_ < auVar48._0_4_ ||
                    auVar45._4_4_ < auVar48._4_4_) & 1)) {
          *(DdManager **)((long)ppDVar28 + lVar33) = table;
        }
        if ((auVar48._12_4_ != auVar45._12_4_ || auVar48._8_4_ <= auVar45._8_4_) &&
            auVar48._12_4_ <= auVar45._12_4_) {
          *(DdManager **)((long)ppDVar28 + lVar33 + 8) = table;
        }
        lVar47 = auVar46._8_8_;
        auVar46._0_8_ = auVar46._0_8_ + 2;
        auVar46._8_8_ = lVar47 + 2;
        lVar33 = lVar33 + 0x10;
      } while ((ulong)(local_b0 + 1 >> 1) << 4 != lVar33);
    }
    while (local_dc = iVar23, ppDVar41 = ppDVar28, pDVar43 != (DdManager *)0x0) {
      pDVar35 = (pDVar43->sentinel).type.kids.T;
      pDVar37 = (pDVar43->sentinel).type.kids.E;
      pDVar10 = (DdManager *)(pDVar43->sentinel).next;
      ppDVar41 = ppDVar28 +
                 (int)((((uint)pDVar37 & 1) +
                        *(int *)(((ulong)pDVar37 & 0xfffffffffffffffe) + 0x20) * 2 +
                       (((uint)pDVar35 & 1) +
                       *(int *)(((ulong)pDVar35 & 0xfffffffffffffffe) + 0x20) * 2) * 0xc00005) *
                       0x40f1f9 >> ((byte)iVar23 & 0x1f));
      do {
        ppDVar31 = ppDVar41;
        pDVar39 = *ppDVar31;
        pDVar29 = (pDVar39->type).kids.T;
        ppDVar41 = &pDVar39->next;
      } while (pDVar35 < pDVar29);
      if ((pDVar35 == pDVar29) && (pDVar37 < (pDVar39->type).kids.E)) {
        do {
          pDVar29 = pDVar39;
          pDVar39 = pDVar29->next;
          if (pDVar35 != (pDVar39->type).kids.T) break;
        } while (pDVar37 < (pDVar39->type).kids.E);
        ppDVar31 = &pDVar29->next;
      }
      (pDVar43->sentinel).next = pDVar39;
      *ppDVar31 = &pDVar43->sentinel;
      pDVar43 = pDVar10;
    }
joined_r0x0080cd4e:
    while (pDVar42 != (DdManager *)0x0) {
      pDVar35 = (pDVar42->sentinel).type.kids.T;
      pDVar37 = pDVar35;
      pDVar39 = pDVar35;
      if (pDVar35->index == y_00) {
        pDVar37 = (pDVar35->type).kids.T;
        pDVar39 = (pDVar35->type).kids.E;
      }
      pDVar29 = (pDVar42->sentinel).type.kids.E;
      pDVar44 = (DdNode *)((ulong)pDVar29 & 0xfffffffffffffffe);
      pDVar34 = pDVar44;
      pDVar30 = pDVar44;
      if (pDVar44->index == y_00) {
        pDVar30 = (pDVar44->type).kids.T;
        pDVar34 = (pDVar44->type).kids.E;
      }
      pDVar43 = (DdManager *)(pDVar42->sentinel).next;
      pDVar38 = (DdNode *)((ulong)pDVar34 ^ 1);
      pDVar15 = (DdNode *)((ulong)pDVar30 ^ 1);
      if (((ulong)pDVar29 & 1) == 0) {
        pDVar38 = pDVar34;
        pDVar15 = pDVar30;
      }
      pDVar35->ref = pDVar35->ref - 1;
      pDVar35 = pDVar37;
      pDVar29 = pDVar37;
      if (pDVar37 != pDVar15) {
        ppDVar28 = ppDVar41 +
                   (int)((((uint)pDVar15 & 1) +
                          (int)((DdNode *)((ulong)pDVar15 & 0xfffffffffffffffe))->Id * 2 +
                         (((uint)pDVar37 & 1) +
                         *(int *)(((ulong)pDVar37 & 0xfffffffffffffffe) + 0x20) * 2) * 0xc00005) *
                         0x40f1f9 >> ((byte)local_dc & 0x1f));
        do {
          ppDVar31 = ppDVar28;
          pDVar35 = *ppDVar31;
          pDVar29 = (pDVar35->type).kids.T;
          ppDVar28 = &pDVar35->next;
        } while (pDVar37 < pDVar29);
        if (pDVar37 == pDVar29) {
          pDVar30 = (pDVar35->type).kids.E;
          if (pDVar15 < pDVar30) {
            do {
              pDVar29 = pDVar35;
              pDVar35 = pDVar29->next;
              if (pDVar37 != (pDVar35->type).kids.T) {
                ppDVar31 = &pDVar29->next;
                goto LAB_0080ce68;
              }
              pDVar30 = (pDVar35->type).kids.E;
            } while (pDVar15 < pDVar30);
            ppDVar31 = &pDVar29->next;
          }
          pDVar29 = pDVar35;
          if (pDVar30 == pDVar15) goto LAB_0080cee0;
        }
LAB_0080ce68:
        pDVar29 = cuddDynamicAllocNode(table);
        if (pDVar29 == (DdNode *)0x0) goto LAB_0080d273;
        pDVar29->index = x_00;
        pDVar29->ref = 1;
        (pDVar29->type).kids.T = pDVar37;
        (pDVar29->type).kids.E = pDVar15;
        uVar26 = uVar26 + 1;
        pDVar29->next = *ppDVar31;
        *ppDVar31 = pDVar29;
        pDVar37->ref = pDVar37->ref + 1;
        pDVar35 = (DdNode *)((ulong)pDVar15 & 0xfffffffffffffffe);
      }
LAB_0080cee0:
      pDVar35->ref = pDVar35->ref + 1;
      (pDVar42->sentinel).type.kids.T = pDVar29;
      pDVar44->ref = pDVar44->ref - 1;
      if (pDVar39 == pDVar38) {
        piVar11 = (int *)(((ulong)pDVar39 & 0xfffffffffffffffe) + 4);
        *piVar11 = *piVar11 + 1;
      }
      else {
        pDVar37 = (DdNode *)((ulong)pDVar39 & 0xfffffffffffffffe);
        pDVar35 = (DdNode *)((ulong)pDVar38 ^ 1);
        if (((ulong)pDVar39 & 1) == 0) {
          pDVar37 = pDVar39;
          pDVar35 = pDVar38;
        }
        ppDVar28 = ppDVar41 +
                   (int)((((uint)pDVar35 & 1) +
                          (int)((DdNode *)((ulong)pDVar35 & 0xfffffffffffffffe))->Id * 2 +
                         (((uint)pDVar37 & 1) +
                         *(int *)(((ulong)pDVar37 & 0xfffffffffffffffe) + 0x20) * 2) * 0xc00005) *
                         0x40f1f9 >> ((byte)local_dc & 0x1f));
        do {
          ppDVar31 = ppDVar28;
          pDVar30 = *ppDVar31;
          pDVar34 = (pDVar30->type).kids.T;
          ppDVar28 = &pDVar30->next;
        } while (pDVar37 < pDVar34);
        if (pDVar37 == pDVar34) {
          pDVar34 = (pDVar30->type).kids.E;
          if (pDVar35 < pDVar34) {
            do {
              pDVar44 = pDVar30;
              pDVar30 = pDVar44->next;
              if (pDVar37 != (pDVar30->type).kids.T) {
                ppDVar31 = &pDVar44->next;
                goto LAB_0080cf9a;
              }
              pDVar34 = (pDVar30->type).kids.E;
            } while (pDVar35 < pDVar34);
            ppDVar31 = &pDVar44->next;
          }
          pDVar38 = pDVar30;
          if (pDVar34 != pDVar35) goto LAB_0080cf9a;
        }
        else {
LAB_0080cf9a:
          pDVar38 = cuddDynamicAllocNode(table);
          if (pDVar38 == (DdNode *)0x0) {
LAB_0080d273:
            fwrite("Error: cuddSwapInPlace out of memory\n",0x25,1,(FILE *)table->err);
            return 0;
          }
          pDVar38->index = x_00;
          pDVar38->ref = 1;
          (pDVar38->type).kids.T = pDVar37;
          (pDVar38->type).kids.E = pDVar35;
          uVar26 = uVar26 + 1;
          pDVar38->next = *ppDVar31;
          *ppDVar31 = pDVar38;
          pDVar37->ref = pDVar37->ref + 1;
          pDVar30 = (DdNode *)((ulong)pDVar35 & 0xfffffffffffffffe);
        }
        pDVar30->ref = pDVar30->ref + 1;
        if (((ulong)pDVar39 & 1) != 0) {
          pDVar38 = (DdNode *)((ulong)pDVar38 ^ 1);
        }
      }
      (pDVar42->sentinel).type.kids.E = pDVar38;
      ppDVar28 = ppDVar9 + (int)((((uint)pDVar38 & 1) +
                                  *(int *)(((ulong)pDVar38 & 0xfffffffffffffffe) + 0x20) * 2 +
                                 (((uint)pDVar29 & 1) +
                                 *(int *)(((ulong)pDVar29 & 0xfffffffffffffffe) + 0x20) * 2) *
                                 0xc00005) * 0x40f1f9 >> ((byte)iVar4 & 0x1f));
      do {
        ppDVar31 = ppDVar28;
        pDVar35 = *ppDVar31;
        pDVar37 = (pDVar35->type).kids.T;
        ppDVar28 = &pDVar35->next;
      } while (pDVar29 < pDVar37);
      if ((pDVar29 == pDVar37) && (pDVar38 < (pDVar35->type).kids.E)) {
        do {
          pDVar37 = pDVar35;
          pDVar35 = pDVar37->next;
          if (pDVar29 != (pDVar35->type).kids.T) break;
        } while (pDVar38 < (pDVar35->type).kids.E);
        ppDVar31 = &pDVar37->next;
      }
      (pDVar42->sentinel).next = pDVar35;
      *ppDVar31 = &pDVar42->sentinel;
      local_c8 = local_c8 + 1;
      pDVar42 = pDVar43;
    }
  }
  if (0 < (int)uVar3) {
    uVar32 = 0;
    do {
      ppDVar28 = ppDVar9 + uVar32;
      pDVar42 = (DdManager *)*ppDVar28;
      while (pDVar42 != table) {
        pDVar43 = (DdManager *)(pDVar42->sentinel).next;
        if ((pDVar42->sentinel).ref == 0) {
          pDVar1 = &((pDVar42->sentinel).type.kids.T)->ref;
          *pDVar1 = *pDVar1 - 1;
          piVar11 = (int *)(((ulong)(pDVar42->sentinel).type.kids.E & 0xfffffffffffffffe) + 4);
          *piVar11 = *piVar11 + -1;
          (pDVar42->sentinel).next = table->nextFree;
          table->nextFree = &pDVar42->sentinel;
          local_c8 = local_c8 - 1;
          pDVar42 = pDVar43;
        }
        else {
          *ppDVar28 = &pDVar42->sentinel;
          ppDVar28 = &(pDVar42->sentinel).next;
          pDVar42 = pDVar43;
        }
      }
      *ppDVar28 = &table->sentinel;
      uVar32 = uVar32 + 1;
    } while (uVar32 != uVar3);
  }
  table->isolated =
       (-(uint)(DVar6 == 1) - (uint)(DVar5 == 1)) + (uint)(table->vars[(int)x_00]->ref == 1) +
       table->isolated + (uint)(table->vars[(int)y_00]->ref == 1);
LAB_0080d18f:
  pDVar8 = table->subtables;
  pDVar8[x].nodelist = ppDVar9;
  pDVar8[x].slots = uVar3;
  pDVar8[x].shift = iVar4;
  pDVar8[x].keys = local_c8;
  pDVar8[x].maxKeys = uVar3 << 2;
  pDVar17 = pDVar8 + x;
  iVar4 = pDVar17->bindVar;
  CVar20 = pDVar17->varType;
  uVar13 = *(undefined8 *)(&pDVar17->bindVar + 2);
  pDVar17 = pDVar8 + y;
  CVar19 = pDVar17->varType;
  uVar14 = *(undefined8 *)(&pDVar17->bindVar + 2);
  pDVar18 = pDVar8 + x;
  pDVar18->bindVar = pDVar17->bindVar;
  pDVar18->varType = CVar19;
  *(undefined8 *)(&pDVar18->bindVar + 2) = uVar14;
  pDVar17 = pDVar8 + y;
  pDVar17->bindVar = iVar4;
  pDVar17->varType = CVar20;
  *(undefined8 *)(&pDVar17->bindVar + 2) = uVar13;
  CVar7 = pDVar8[x].varToBeGrouped;
  pDVar8[x].varToBeGrouped = pDVar8[y].varToBeGrouped;
  pDVar8[y].varToBeGrouped = CVar7;
  pDVar8[y].nodelist = ppDVar41;
  pDVar8[y].slots = local_b0;
  pDVar8[y].shift = local_dc;
  pDVar8[y].keys = uVar26;
  pDVar8[y].maxKeys = local_b0 << 2;
  piVar11 = table->perm;
  piVar11[(int)x_00] = y;
  piVar11[(int)y_00] = x;
  piVar11 = table->invperm;
  piVar11[x] = y_00;
  piVar11[y] = x_00;
  uVar40 = (local_c8 - (uVar2 + uVar40)) + uVar26 + table->keys;
  table->keys = uVar40;
  return uVar40 - table->isolated;
}

Assistant:

int
cuddSwapInPlace(
  DdManager * table,
  int  x,
  int  y)
{
    DdNodePtr *xlist, *ylist;
    int    xindex, yindex;
    int    xslots, yslots;
    int    xshift, yshift;
    int    oldxkeys, oldykeys;
    int    newxkeys, newykeys;
    int    comple, newcomplement;
    int    i;
    Cudd_VariableType varType;
    Cudd_LazyGroupType groupType;
    int    posn;
    int    isolated;
    DdNode *f,*f0,*f1,*f01,*f00,*f11,*f10,*newf1,*newf0;
    DdNode *g,*next;
    DdNodePtr *previousP;
    DdNode *tmp;
    DdNode *sentinel = &(table->sentinel);
    extern DD_OOMFP MMoutOfMemory;
    DD_OOMFP saveHandler;

#ifdef DD_DEBUG
    int    count,idcheck;
#endif

#ifdef DD_DEBUG
    assert(x < y);
    assert(cuddNextHigh(table,x) == y);
    assert(table->subtables[x].keys != 0);
    assert(table->subtables[y].keys != 0);
    assert(table->subtables[x].dead == 0);
    assert(table->subtables[y].dead == 0);
#endif

    ddTotalNumberSwapping++;

    /* Get parameters of x subtable. */
    xindex = table->invperm[x];
    xlist = table->subtables[x].nodelist;
    oldxkeys = table->subtables[x].keys;
    xslots = table->subtables[x].slots;
    xshift = table->subtables[x].shift;

    /* Get parameters of y subtable. */
    yindex = table->invperm[y];
    ylist = table->subtables[y].nodelist;
    oldykeys = table->subtables[y].keys;
    yslots = table->subtables[y].slots;
    yshift = table->subtables[y].shift;

    if (!cuddTestInteract(table,xindex,yindex)) {
#ifdef DD_STATS
        ddTotalNISwaps++;
#endif
        newxkeys = oldxkeys;
        newykeys = oldykeys;
    } else {
        newxkeys = 0;
        newykeys = oldykeys;

        /* Check whether the two projection functions involved in this
        ** swap are isolated. At the end, we'll be able to tell how many
        ** isolated projection functions are there by checking only these
        ** two functions again. This is done to eliminate the isolated
        ** projection functions from the node count.
        */
        isolated = - ((table->vars[xindex]->ref == 1) +
                     (table->vars[yindex]->ref == 1));

        /* The nodes in the x layer that do not depend on
        ** y will stay there; the others are put in a chain.
        ** The chain is handled as a LIFO; g points to the beginning.
        */
        g = NULL;
        if ((oldxkeys >= xslots || (unsigned) xslots == table->initSlots) &&
            oldxkeys <= DD_MAX_SUBTABLE_DENSITY * xslots) {
            for (i = 0; i < xslots; i++) {
                previousP = &(xlist[i]);
                f = *previousP;
                while (f != sentinel) {
                    next = f->next;
                    f1 = cuddT(f); f0 = cuddE(f);
                    if (f1->index != (DdHalfWord) yindex &&
                        Cudd_Regular(f0)->index != (DdHalfWord) yindex) {
                        /* stays */
                        newxkeys++;
                        *previousP = f;
                        previousP = &(f->next);
                    } else {
                        f->index = yindex;
                        f->next = g;
                        g = f;
                    }
                    f = next;
                } /* while there are elements in the collision chain */
                *previousP = sentinel;
            } /* for each slot of the x subtable */
        } else {                /* resize xlist */
            DdNode *h = NULL;
            DdNodePtr *newxlist;
            unsigned int newxslots;
            int newxshift;
            /* Empty current xlist. Nodes that stay go to list h;
            ** nodes that move go to list g. */
            for (i = 0; i < xslots; i++) {
                f = xlist[i];
                while (f != sentinel) {
                    next = f->next;
                    f1 = cuddT(f); f0 = cuddE(f);
                    if (f1->index != (DdHalfWord) yindex &&
                        Cudd_Regular(f0)->index != (DdHalfWord) yindex) {
                        /* stays */
                        f->next = h;
                        h = f;
                        newxkeys++;
                    } else {
                        f->index = yindex;
                        f->next = g;
                        g = f;
                    }
                    f = next;
                } /* while there are elements in the collision chain */
            } /* for each slot of the x subtable */
            /* Decide size of new subtable. */
            newxshift = xshift;
            newxslots = xslots;
            while ((unsigned) oldxkeys > DD_MAX_SUBTABLE_DENSITY * newxslots) {
                newxshift--;
                newxslots <<= 1;
            }
            while ((unsigned) oldxkeys < newxslots &&
                   newxslots > table->initSlots) {
                newxshift++;
                newxslots >>= 1;
            }
            /* Try to allocate new table. Be ready to back off. */
            saveHandler = MMoutOfMemory;
            MMoutOfMemory = Cudd_OutOfMem;
            newxlist = ABC_ALLOC(DdNodePtr, newxslots);
            MMoutOfMemory = saveHandler;
            if (newxlist == NULL) {
                (void) fprintf(table->err, "Unable to resize subtable %d for lack of memory\n", i);
                newxlist = xlist;
                newxslots = xslots;
                newxshift = xshift;
            } else {
                table->slots += ((int) newxslots - xslots);
                table->minDead = (unsigned)
                    (table->gcFrac * (double) table->slots);
                table->cacheSlack = (int)
                    ddMin(table->maxCacheHard, DD_MAX_CACHE_TO_SLOTS_RATIO
                          * table->slots) - 2 * (int) table->cacheSlots;
                table->memused +=
                    ((int) newxslots - xslots) * sizeof(DdNodePtr);
                ABC_FREE(xlist);
                xslots =  newxslots;
                xshift = newxshift;
                xlist = newxlist;
            }
            /* Initialize new subtable. */
            for (i = 0; i < xslots; i++) {
                xlist[i] = sentinel;
            }
            /* Move nodes that were parked in list h to their new home. */
            f = h;
            while (f != NULL) {
                next = f->next;
                f1 = cuddT(f);
                f0 = cuddE(f);
                /* Check xlist for pair (f11,f01). */
                posn = ddHash(cuddF2L(f1), cuddF2L(f0), xshift);
                /* For each element tmp in collision list xlist[posn]. */
                previousP = &(xlist[posn]);
                tmp = *previousP;
                while (f1 < cuddT(tmp)) {
                    previousP = &(tmp->next);
                    tmp = *previousP;
                }
                while (f1 == cuddT(tmp) && f0 < cuddE(tmp)) {
                    previousP = &(tmp->next);
                    tmp = *previousP;
                }
                f->next = *previousP;
                *previousP = f;
                f = next;
            }
        }

#ifdef DD_COUNT
        table->swapSteps += oldxkeys - newxkeys;
#endif
        /* Take care of the x nodes that must be re-expressed.
        ** They form a linked list pointed by g. Their index has been
        ** already changed to yindex.
        */
        f = g;
        while (f != NULL) {
            next = f->next;
            /* Find f1, f0, f11, f10, f01, f00. */
            f1 = cuddT(f);
#ifdef DD_DEBUG
            assert(!(Cudd_IsComplement(f1)));
#endif
            if ((int) f1->index == yindex) {
                f11 = cuddT(f1); f10 = cuddE(f1);
            } else {
                f11 = f10 = f1;
            }
#ifdef DD_DEBUG
            assert(!(Cudd_IsComplement(f11)));
#endif
            f0 = cuddE(f);
            comple = Cudd_IsComplement(f0);
            f0 = Cudd_Regular(f0);
            if ((int) f0->index == yindex) {
                f01 = cuddT(f0); f00 = cuddE(f0);
            } else {
                f01 = f00 = f0;
            }
            if (comple) {
                f01 = Cudd_Not(f01);
                f00 = Cudd_Not(f00);
            }
            /* Decrease ref count of f1. */
            cuddSatDec(f1->ref);
            /* Create the new T child. */
            if (f11 == f01) {
                newf1 = f11;
                cuddSatInc(newf1->ref);
            } else {
                /* Check xlist for triple (xindex,f11,f01). */
                posn = ddHash(cuddF2L(f11), cuddF2L(f01), xshift);
                /* For each element newf1 in collision list xlist[posn]. */
                previousP = &(xlist[posn]);
                newf1 = *previousP;
                while (f11 < cuddT(newf1)) {
                    previousP = &(newf1->next);
                    newf1 = *previousP;
                }
                while (f11 == cuddT(newf1) && f01 < cuddE(newf1)) {
                    previousP = &(newf1->next);
                    newf1 = *previousP;
                }
                if (cuddT(newf1) == f11 && cuddE(newf1) == f01) {
                    cuddSatInc(newf1->ref);
                } else { /* no match */
                    newf1 = cuddDynamicAllocNode(table);
                    if (newf1 == NULL)
                        goto cuddSwapOutOfMem;
                    newf1->index = xindex; newf1->ref = 1;
                    cuddT(newf1) = f11;
                    cuddE(newf1) = f01;
                    /* Insert newf1 in the collision list xlist[posn];
                    ** increase the ref counts of f11 and f01.
                    */
                    newxkeys++;
                    newf1->next = *previousP;
                    *previousP = newf1;
                    cuddSatInc(f11->ref);
                    tmp = Cudd_Regular(f01);
                    cuddSatInc(tmp->ref);
                }
            }
            cuddT(f) = newf1;
#ifdef DD_DEBUG
            assert(!(Cudd_IsComplement(newf1)));
#endif

            /* Do the same for f0, keeping complement dots into account. */
            /* Decrease ref count of f0. */
            tmp = Cudd_Regular(f0);
            cuddSatDec(tmp->ref);
            /* Create the new E child. */
            if (f10 == f00) {
                newf0 = f00;
                tmp = Cudd_Regular(newf0);
                cuddSatInc(tmp->ref);
            } else {
                /* make sure f10 is regular */
                newcomplement = Cudd_IsComplement(f10);
                if (newcomplement) {
                    f10 = Cudd_Not(f10);
                    f00 = Cudd_Not(f00);
                }
                /* Check xlist for triple (xindex,f10,f00). */
                posn = ddHash(cuddF2L(f10), cuddF2L(f00), xshift);
                /* For each element newf0 in collision list xlist[posn]. */
                previousP = &(xlist[posn]);
                newf0 = *previousP;
                while (f10 < cuddT(newf0)) {
                    previousP = &(newf0->next);
                    newf0 = *previousP;
                }
                while (f10 == cuddT(newf0) && f00 < cuddE(newf0)) {
                    previousP = &(newf0->next);
                    newf0 = *previousP;
                }
                if (cuddT(newf0) == f10 && cuddE(newf0) == f00) {
                    cuddSatInc(newf0->ref);
                } else { /* no match */
                    newf0 = cuddDynamicAllocNode(table);
                    if (newf0 == NULL)
                        goto cuddSwapOutOfMem;
                    newf0->index = xindex; newf0->ref = 1;
                    cuddT(newf0) = f10;
                    cuddE(newf0) = f00;
                    /* Insert newf0 in the collision list xlist[posn];
                    ** increase the ref counts of f10 and f00.
                    */
                    newxkeys++;
                    newf0->next = *previousP;
                    *previousP = newf0;
                    cuddSatInc(f10->ref);
                    tmp = Cudd_Regular(f00);
                    cuddSatInc(tmp->ref);
                }
                if (newcomplement) {
                    newf0 = Cudd_Not(newf0);
                }
            }
            cuddE(f) = newf0;

            /* Insert the modified f in ylist.
            ** The modified f does not already exists in ylist.
            ** (Because of the uniqueness of the cofactors.)
            */
            posn = ddHash(cuddF2L(newf1), cuddF2L(newf0), yshift);
            newykeys++;
            previousP = &(ylist[posn]);
            tmp = *previousP;
            while (newf1 < cuddT(tmp)) {
                previousP = &(tmp->next);
                tmp = *previousP;
            }
            while (newf1 == cuddT(tmp) && newf0 < cuddE(tmp)) {
                previousP = &(tmp->next);
                tmp = *previousP;
            }
            f->next = *previousP;
            *previousP = f;
            f = next;
        } /* while f != NULL */

        /* GC the y layer. */

        /* For each node f in ylist. */
        for (i = 0; i < yslots; i++) {
            previousP = &(ylist[i]);
            f = *previousP;
            while (f != sentinel) {
                next = f->next;
                if (f->ref == 0) {
                    tmp = cuddT(f);
                    cuddSatDec(tmp->ref);
                    tmp = Cudd_Regular(cuddE(f));
                    cuddSatDec(tmp->ref);
                    cuddDeallocNode(table,f);
                    newykeys--;
                } else {
                    *previousP = f;
                    previousP = &(f->next);
                }
                f = next;
            } /* while f */
            *previousP = sentinel;
        } /* for i */

#ifdef DD_DEBUG
#if 0
        (void) fprintf(table->out,"Swapping %d and %d\n",x,y);
#endif
        count = 0;
        idcheck = 0;
        for (i = 0; i < yslots; i++) {
            f = ylist[i];
            while (f != sentinel) {
                count++;
                if (f->index != (DdHalfWord) yindex)
                    idcheck++;
                f = f->next;
            }
        }
        if (count != newykeys) {
            (void) fprintf(table->out,
                           "Error in finding newykeys\toldykeys = %d\tnewykeys = %d\tactual = %d\n",
                           oldykeys,newykeys,count);
        }
        if (idcheck != 0)
            (void) fprintf(table->out,
                           "Error in id's of ylist\twrong id's = %d\n",
                           idcheck);
        count = 0;
        idcheck = 0;
        for (i = 0; i < xslots; i++) {
            f = xlist[i];
            while (f != sentinel) {
                count++;
                if (f->index != (DdHalfWord) xindex)
                    idcheck++;
                f = f->next;
            }
        }
        if (count != newxkeys) {
            (void) fprintf(table->out,
                           "Error in finding newxkeys\toldxkeys = %d \tnewxkeys = %d \tactual = %d\n",
                           oldxkeys,newxkeys,count);
        }
        if (idcheck != 0)
            (void) fprintf(table->out,
                           "Error in id's of xlist\twrong id's = %d\n",
                           idcheck);
#endif

        isolated += (table->vars[xindex]->ref == 1) +
                    (table->vars[yindex]->ref == 1);
        table->isolated += isolated;
    }

    /* Set the appropriate fields in table. */
    table->subtables[x].nodelist = ylist;
    table->subtables[x].slots = yslots;
    table->subtables[x].shift = yshift;
    table->subtables[x].keys = newykeys;
    table->subtables[x].maxKeys = yslots * DD_MAX_SUBTABLE_DENSITY;
    i = table->subtables[x].bindVar;
    table->subtables[x].bindVar = table->subtables[y].bindVar;
    table->subtables[y].bindVar = i;
    /* Adjust filds for lazy sifting. */
    varType = table->subtables[x].varType;
    table->subtables[x].varType = table->subtables[y].varType;
    table->subtables[y].varType = varType;
    i = table->subtables[x].pairIndex;
    table->subtables[x].pairIndex = table->subtables[y].pairIndex;
    table->subtables[y].pairIndex = i;
    i = table->subtables[x].varHandled;
    table->subtables[x].varHandled = table->subtables[y].varHandled;
    table->subtables[y].varHandled = i;
    groupType = table->subtables[x].varToBeGrouped;
    table->subtables[x].varToBeGrouped = table->subtables[y].varToBeGrouped;
    table->subtables[y].varToBeGrouped = groupType;

    table->subtables[y].nodelist = xlist;
    table->subtables[y].slots = xslots;
    table->subtables[y].shift = xshift;
    table->subtables[y].keys = newxkeys;
    table->subtables[y].maxKeys = xslots * DD_MAX_SUBTABLE_DENSITY;

    table->perm[xindex] = y; table->perm[yindex] = x;
    table->invperm[x] = yindex; table->invperm[y] = xindex;

    table->keys += newxkeys + newykeys - oldxkeys - oldykeys;

    return(table->keys - table->isolated);

cuddSwapOutOfMem:
    (void) fprintf(table->err,"Error: cuddSwapInPlace out of memory\n");

    return (0);

}